

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# term.hh
# Opt level: O0

string * OB::Term::ANSI_Escape_Codes::fg_256(string *__return_storage_ptr__,string *str_)

{
  ostream *poVar1;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [380];
  int local_1c;
  string *psStack_18;
  int n;
  string *str__local;
  
  psStack_18 = str_;
  str__local = __return_storage_ptr__;
  local_1c = std::__cxx11::stoi(str_,(size_t *)0x0,10);
  if ((local_1c < 0) || (0x100 < local_1c)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1a8);
    poVar1 = std::operator<<(local_198,(string *)esc_abi_cxx11_);
    poVar1 = std::operator<<(poVar1,"[38;5;");
    poVar1 = std::operator<<(poVar1,(string *)psStack_18);
    std::operator<<(poVar1,"m");
    std::__cxx11::stringstream::str();
    std::__cxx11::stringstream::~stringstream(local_1a8);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string fg_256(std::string const& str_)
{
  auto const n = std::stoi(str_);
  if (n < 0 || n > 256) return {};
  std::stringstream ss;
  ss << esc << "[38;5;" << str_ << "m";

  return ss.str();
}